

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O0

float rsg::anon_unknown_0::getWeight<rsg::ParenOp>
                (GeneratorState *state,ConstValueRangeAccess valueRange)

{
  float fVar1;
  GeneratorState *state_local;
  
  fVar1 = ParenOp::getWeight(state,valueRange);
  return fVar1;
}

Assistant:

Expression*	create		(GeneratorState& state, ConstValueRangeAccess valueRange)		{ return new T(state, valueRange);			}